

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsact.c
# Opt level: O0

Symbol * ifnew_parminstall(char *name,char *num,char *units,char *limits)

{
  Symbol *s2;
  char *in_RCX;
  undefined8 in_RDX;
  int t;
  char *in_RSI;
  Symbol *s;
  char *in_stack_00001fd8;
  char *in_stack_00001fe0;
  char *in_stack_00001fe8;
  Symbol *in_stack_00001ff0;
  char *in_stack_ffffffffffffffd8;
  
  t = (int)((ulong)in_RDX >> 0x20);
  s2 = lookup(in_stack_ffffffffffffffd8);
  if (s2 == (Symbol *)0x0) {
    s2 = install(in_RSI,t);
    parminstall(in_stack_00001ff0,in_stack_00001fe8,in_stack_00001fe0,in_stack_00001fd8);
  }
  if (s2->subtype == 0) {
    parminstall(in_stack_00001ff0,in_stack_00001fe8,in_stack_00001fe0,in_stack_00001fd8);
  }
  if (((s2->subtype & 0x2002U) == 0) && ((scop_indep == indepsym || (s2 != scop_indep)))) {
    diag(in_RCX,(char *)s2);
  }
  return s2;
}

Assistant:

void parminstall(n, num, units, limits)
	Symbol         *n;
	char           *num, *units, *limits;
{
	char buf[NRN_BUFSIZE];

	previous_subtype = n->subtype;	
	previous_str = n->u.str;
	if (n->u.str == (char *) 0)
		Lappendsym(syminorder, n);
	n->subtype |= PARM;
	Sprintf(buf, "\n%s\n%s\n%s\n", num, units, limits);
	n->u.str = stralloc(buf, (char *) 0);
}